

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void cmGlobalNinjaGenerator::WriteVariable
               (ostream *os,string *name,string *value,string *comment,int indent)

{
  string_view str;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  string local_110;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_f0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_e8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_de;
  key_equal local_dd;
  hasher local_dc;
  undefined1 local_db;
  allocator<char> local_da;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0 [32];
  iterator local_90;
  size_type local_88;
  string local_80 [8];
  string val;
  string local_50;
  int local_2c;
  string *psStack_28;
  int indent_local;
  string *comment_local;
  string *value_local;
  string *name_local;
  ostream *os_local;
  
  local_2c = indent;
  psStack_28 = comment;
  comment_local = value;
  value_local = name;
  name_local = (string *)os;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::string(local_80);
    if ((WriteVariable(std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int)
         ::variablesShouldNotBeTrimmed_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&WriteVariable(std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int)
                                     ::variablesShouldNotBeTrimmed_abi_cxx11_), iVar2 != 0)) {
      local_db = 1;
      local_d8 = &local_d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"CODE_CHECK",&local_d9)
      ;
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_b0,"LAUNCHER",&local_da);
      local_db = 0;
      local_90 = &local_d0;
      local_88 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_de);
      __l._M_len = local_88;
      __l._M_array = local_90;
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unordered_set(&WriteVariable(std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int)
                       ::variablesShouldNotBeTrimmed_abi_cxx11_,__l,0,&local_dc,&local_dd,&local_de)
      ;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_de);
      local_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90;
      do {
        local_160 = local_160 + -1;
        std::__cxx11::string::~string((string *)local_160);
      } while (local_160 != &local_d0);
      std::allocator<char>::~allocator(&local_da);
      std::allocator<char>::~allocator(&local_d9);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &WriteVariable(std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int)
                    ::variablesShouldNotBeTrimmed_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&WriteVariable(std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int)
                           ::variablesShouldNotBeTrimmed_abi_cxx11_);
    }
    local_e8._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&WriteVariable(std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int)
                 ::variablesShouldNotBeTrimmed_abi_cxx11_,value_local);
    local_f0._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&WriteVariable(std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int)
                ::variablesShouldNotBeTrimmed_abi_cxx11_);
    bVar1 = std::__detail::operator==(&local_e8,&local_f0);
    if (bVar1) {
      str = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)comment_local);
      cmTrimWhitespace_abi_cxx11_(&local_110,str);
      std::__cxx11::string::operator=(local_80,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
    }
    else {
      std::__cxx11::string::operator=(local_80,(string *)comment_local);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      WriteComment((ostream *)name_local,psStack_28);
      Indent((ostream *)name_local,local_2c);
      poVar4 = std::operator<<((ostream *)name_local,(string *)value_local);
      poVar4 = std::operator<<(poVar4," = ");
      poVar4 = std::operator<<(poVar4,local_80);
      std::operator<<(poVar4,"\n");
    }
    std::__cxx11::string::~string(local_80);
  }
  else {
    cmStrCat<char_const(&)[55],std::__cxx11::string_const&>
              (&local_50,(char (*) [55])"No name given for WriteVariable! called with comment: ",
               psStack_28);
    cmSystemTools::Error(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteVariable(std::ostream& os,
                                           const std::string& name,
                                           const std::string& value,
                                           const std::string& comment,
                                           int indent)
{
  // Make sure we have a name.
  if (name.empty()) {
    cmSystemTools::Error(cmStrCat("No name given for WriteVariable! called "
                                  "with comment: ",
                                  comment));
    return;
  }

  std::string val;
  static std::unordered_set<std::string> const variablesShouldNotBeTrimmed = {
    "CODE_CHECK", "LAUNCHER"
  };
  if (variablesShouldNotBeTrimmed.find(name) ==
      variablesShouldNotBeTrimmed.end()) {
    val = cmTrimWhitespace(value);
  } else {
    val = value;
  }

  // Do not add a variable if the value is empty.
  if (val.empty()) {
    return;
  }

  cmGlobalNinjaGenerator::WriteComment(os, comment);
  cmGlobalNinjaGenerator::Indent(os, indent);
  os << name << " = " << val << "\n";
}